

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4hc.c
# Opt level: O3

int LZ4_compress_HC_destSize
              (void *state,char *source,char *dest,int *sourceSizePtr,int targetDestSize,int cLevel)

{
  int iVar1;
  undefined2 uVar2;
  LZ4_streamHC_t *LZ4_streamHCPtr;
  
  if (((ulong)state & 7) == 0 && state != (void *)0x0) {
    memset(state,0,0x40030);
    *(undefined4 *)((long)state + 0x40020) = 0x10000;
    *(char **)((long)state + 0x40008) = source + -0x10000;
    *(char **)((long)state + 0x40000) = source;
    *(char **)((long)state + 0x40010) = source + -0x10000;
    *(undefined8 *)((long)state + 0x40018) = 0x1000000010000;
    iVar1 = 0xc;
    if ((uint)cLevel < 0xc) {
      iVar1 = cLevel;
    }
    uVar2 = 9;
    if (0 < cLevel) {
      uVar2 = (undefined2)iVar1;
    }
    *(undefined2 *)((long)state + 0x40024) = uVar2;
    iVar1 = LZ4HC_compress_generic
                      ((LZ4HC_CCtx_internal *)state,source,dest,sourceSizePtr,targetDestSize,cLevel,
                       fillOutput);
  }
  else {
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int LZ4_compress_HC_destSize(void* state, const char* source, char* dest, int* sourceSizePtr, int targetDestSize, int cLevel)
{
    LZ4_streamHC_t* const ctx = LZ4_initStreamHC(state, sizeof(*ctx));
    if (ctx==NULL) return 0;   /* init failure */
    LZ4HC_init_internal(&ctx->internal_donotuse, (const BYTE*) source);
    LZ4_setCompressionLevel(ctx, cLevel);
    return LZ4HC_compress_generic(&ctx->internal_donotuse, source, dest, sourceSizePtr, targetDestSize, cLevel, fillOutput);
}